

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

uint64_t __thiscall mkvmuxer::ContentEncoding::Size(ContentEncoding *this)

{
  uint64_t uVar1;
  uint64 uVar2;
  
  uVar1 = EncryptionSize(this);
  uVar1 = EncodingSize(this,0,uVar1);
  uVar2 = EbmlMasterElementSize(0x6240,uVar1);
  return uVar2 + uVar1;
}

Assistant:

uint64_t ContentEncoding::Size() const {
  const uint64_t encryption_size = EncryptionSize();
  const uint64_t encoding_size = EncodingSize(0, encryption_size);
  const uint64_t encodings_size =
      EbmlMasterElementSize(libwebm::kMkvContentEncoding, encoding_size) +
      encoding_size;

  return encodings_size;
}